

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

void RunControlFlowOptimization(ExpressionContext *ctx,VmModule *module,VmValue *value)

{
  uint *optCount;
  VmInstruction **ppVVar1;
  VmBlock *pVVar2;
  VmValue **ppVVar3;
  VmInstruction *pVVar4;
  bool bVar5;
  uint uVar6;
  VmValue *pVVar7;
  ulong uVar8;
  VmInstruction *pVVar9;
  VmValue *replacement;
  VmValue *pVVar10;
  VmValue *pVVar11;
  uint uVar12;
  ulong uVar13;
  VmValue *pVVar14;
  VmBlock *pVVar15;
  VmInstruction *pVVar16;
  bool bVar17;
  
  if ((value == (VmValue *)0x0) || (value->typeID != 4)) {
    value = (VmValue *)0x0;
  }
  if ((VmFunction *)value != (VmFunction *)0x0) {
    pVVar15 = ((VmFunction *)value)->firstBlock;
    if (pVVar15 != (VmBlock *)0x0) {
      optCount = &module->controlFlowSimplifications;
LAB_00289e0b:
      for (pVVar16 = pVVar15->firstInstruction; pVVar16 != (VmInstruction *)0x0;
          pVVar16 = pVVar16->nextSibling) {
        uVar6 = pVVar16->cmd - VM_INST_JUMP;
        if ((uVar6 < 0x31) && ((0x1100000000037U >> ((ulong)uVar6 & 0x3f) & 1) != 0)) {
          pVVar9 = pVVar15->lastInstruction;
          if (pVVar9 != pVVar16 && pVVar9 != (VmInstruction *)0x0) goto LAB_00289e4c;
          break;
        }
      }
      goto LAB_00289e6b;
    }
LAB_0028a335:
    if (((VmFunction *)value)->firstBlock != (VmBlock *)0x0) {
      pVVar15 = ((VmFunction *)value)->firstBlock;
      do {
        pVVar2 = pVVar15->nextSibling;
        pVVar16 = pVVar15->firstInstruction;
        if ((((pVVar16 != (VmInstruction *)0x0) && (pVVar16 == pVVar15->lastInstruction)) &&
            (pVVar16->cmd == VM_INST_JUMP)) && (pVVar15 != ((VmFunction *)value)->firstBlock)) {
          if ((pVVar16->arguments).count == 0) {
LAB_0028a467:
            __assert_fail("index < count",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x199,
                          "T &SmallArray<VmValue *, 4>::operator[](unsigned int) [T = VmValue *, N = 4]"
                         );
          }
          pVVar10 = *(pVVar16->arguments).data;
          if ((pVVar10 == (VmValue *)0x0) || (pVVar10->typeID != 3)) {
            pVVar10 = (VmValue *)0x0;
          }
          if (pVVar10 == (VmValue *)0x0) {
            __assert_fail("target",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                          ,0x1450,
                          "void RunControlFlowOptimization(ExpressionContext &, VmModule *, VmValue *)"
                         );
          }
          uVar8 = (ulong)(pVVar15->super_VmValue).users.count;
          if (uVar8 != 0) {
            bVar5 = false;
            uVar13 = 1;
            do {
              pVVar14 = (pVVar15->super_VmValue).users.data[uVar13 - 1];
              if ((pVVar14 == (VmValue *)0x0) || (pVVar14->typeID != 2)) {
                pVVar14 = (VmValue *)0x0;
              }
              if ((pVVar14 == (VmValue *)0x0) || (*(int *)&pVVar14[1]._vptr_VmValue != 0x4d)) {
                bVar17 = true;
              }
              else {
                bVar5 = true;
                bVar17 = false;
              }
            } while ((bVar17) && (bVar17 = uVar13 < uVar8, uVar13 = uVar13 + 1, bVar17));
            if (bVar5) goto LAB_0028a42a;
          }
          anon_unknown.dwarf_233176::ReplaceValueUsersWith
                    (module,&pVVar15->super_VmValue,pVVar10,&module->controlFlowSimplifications);
        }
LAB_0028a42a:
        if (((pVVar15->super_VmValue).users.count == 0) &&
           (bVar5 = VmBlock::HasExternalInstructionUsers(pVVar15), !bVar5)) {
          VmFunction::RemoveBlock((VmFunction *)value,pVVar15);
          module->controlFlowSimplifications = module->controlFlowSimplifications + 1;
        }
        pVVar15 = pVVar2;
      } while (pVVar2 != (VmBlock *)0x0);
    }
  }
  return;
  while (pVVar9 != pVVar16) {
LAB_00289e4c:
    module->controlFlowSimplifications = module->controlFlowSimplifications + 1;
    VmBlock::RemoveInstruction(pVVar15,pVVar9);
    pVVar9 = pVVar15->lastInstruction;
    if (pVVar9 == (VmInstruction *)0x0) break;
  }
LAB_00289e6b:
  pVVar16 = pVVar15->lastInstruction;
  if (pVVar16 != (VmInstruction *)0x0) {
    if ((pVVar16->cmd == VM_INST_JUMP) && (pVVar2 = pVVar15->nextSibling, pVVar2 != (VmBlock *)0x0))
    {
      if ((pVVar16->arguments).count == 0) goto LAB_0028a467;
      if ((((VmBlock *)*(pVVar16->arguments).data == pVVar2) &&
          ((pVVar2->super_VmValue).users.count == 1)) &&
         ((VmInstruction *)*(pVVar2->super_VmValue).users.data == pVVar16)) {
        pVVar9 = pVVar2->firstInstruction;
        while (pVVar4 = pVVar9, pVVar4 != (VmInstruction *)0x0) {
          pVVar9 = pVVar4->nextSibling;
          if (pVVar4->cmd == VM_INST_PHI) {
            if (((pVVar4->arguments).count != 2) ||
               (ppVVar3 = (pVVar4->arguments).data, (VmBlock *)ppVVar3[1] != pVVar15)) {
              __assert_fail("inst->arguments.size() == 2 && inst->arguments[1] == curr",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x13c6,
                            "void RunControlFlowOptimization(ExpressionContext &, VmModule *, VmValue *)"
                           );
            }
            anon_unknown.dwarf_233176::ReplaceValueUsersWith
                      (module,&pVVar4->super_VmValue,*ppVVar3,optCount);
          }
        }
        ppVVar1 = &pVVar2->firstInstruction;
        for (pVVar9 = *ppVVar1; pVVar9 != (VmInstruction *)0x0; pVVar9 = pVVar9->nextSibling) {
          pVVar9->parent = pVVar15;
        }
        pVVar9 = pVVar15->lastInstruction;
        if (pVVar9 != (VmInstruction *)0x0) {
          pVVar9->nextSibling = *ppVVar1;
        }
        if (*ppVVar1 != (VmInstruction *)0x0) {
          (*ppVVar1)->prevSibling = pVVar9;
          pVVar15->lastInstruction = pVVar2->lastInstruction;
        }
        *ppVVar1 = (VmInstruction *)0x0;
        pVVar2->lastInstruction = (VmInstruction *)0x0;
        if (pVVar16->parent != (VmBlock *)0x0) {
          VmBlock::RemoveInstruction(pVVar15,pVVar16);
        }
        module->controlFlowSimplifications = module->controlFlowSimplifications + 1;
      }
    }
    if (pVVar16->cmd - VM_INST_JUMP_Z < 2) {
      if ((pVVar16->arguments).count < 3) goto LAB_0028a467;
      ppVVar3 = (pVVar16->arguments).data;
      pVVar2 = (VmBlock *)ppVVar3[2];
      if (pVVar2 == pVVar15->nextSibling) {
        pVVar10 = ppVVar3[1];
        pVVar16->cmd = (pVVar16->cmd == VM_INST_JUMP_Z) + VM_INST_JUMP_Z;
        ppVVar3[1] = (VmValue *)pVVar2;
        (pVVar16->arguments).data[2] = pVVar10;
        module->controlFlowSimplifications = module->controlFlowSimplifications + 1;
      }
    }
    if (pVVar16->cmd - VM_INST_JUMP_Z < 2) {
      uVar6 = (pVVar16->arguments).count;
      if (uVar6 == 0) goto LAB_0028a467;
      ppVVar3 = (pVVar16->arguments).data;
      pVVar9 = (VmInstruction *)*ppVVar3;
      if ((pVVar9 == (VmInstruction *)0x0) || ((pVVar9->super_VmValue).typeID != 2)) {
        pVVar9 = (VmInstruction *)0x0;
      }
      if ((uVar6 == 1) || (uVar6 < 3)) goto LAB_0028a467;
      if ((pVVar9 != (VmInstruction *)0x0) &&
         ((((pVVar9->cmd == VM_INST_PHI && (pVVar9 == pVVar16->prevSibling)) &&
           (pVVar9 == pVVar15->firstInstruction)) && (uVar6 = (pVVar9->arguments).count, uVar6 != 0)
          ))) {
        pVVar10 = ppVVar3[1];
        pVVar14 = ppVVar3[2];
        uVar8 = 0;
        do {
          ppVVar3 = (pVVar9->arguments).data;
          pVVar7 = ppVVar3[uVar8];
          if ((pVVar7 == (VmValue *)0x0) || (pVVar7->typeID != 2)) {
            pVVar7 = (VmValue *)0x0;
          }
          uVar12 = (int)uVar8 + 1;
          if (uVar6 <= uVar12) goto LAB_0028a467;
          pVVar11 = ppVVar3[uVar12];
          if ((pVVar11 == (VmValue *)0x0) || (pVVar11->typeID != 3)) {
            pVVar11 = (VmValue *)0x0;
          }
          if (*(int *)&pVVar7[1]._vptr_VmValue == 7) {
            if (pVVar7[1].type.type == VM_TYPE_VOID) goto LAB_0028a467;
            replacement = pVVar10;
            if ((pVVar16->cmd == VM_INST_JUMP_NZ) ==
                (*(int *)(**(long **)&pVVar7[1].typeID + 0x98) == 0)) {
              replacement = pVVar14;
            }
            pVVar7 = *(VmValue **)&pVVar11[1].hasSideEffects;
            if (*(int *)&pVVar7[1]._vptr_VmValue == 0x1c) {
              if (pVVar7[1].type.type == VM_TYPE_VOID) goto LAB_0028a467;
              if ((VmBlock *)**(undefined8 **)&pVVar7[1].typeID != pVVar15) {
                __assert_fail("terminator->arguments[0] == curr",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                              ,0x1412,
                              "void RunControlFlowOptimization(ExpressionContext &, VmModule *, VmValue *)"
                             );
              }
              anon_unknown.dwarf_233176::ReplaceValue
                        (module,pVVar7,(VmValue *)**(undefined8 **)&pVVar7[1].typeID,replacement);
              module->controlFlowSimplifications = module->controlFlowSimplifications + 1;
            }
          }
          uVar12 = (int)uVar8 + 2;
          uVar8 = (ulong)uVar12;
          uVar6 = (pVVar9->arguments).count;
        } while (uVar12 < uVar6);
      }
    }
    if ((pVVar16->cmd == VM_INST_RETURN) && ((pVVar16->arguments).count != 0)) {
      pVVar9 = (VmInstruction *)*(pVVar16->arguments).data;
      if ((pVVar9 == (VmInstruction *)0x0) || ((pVVar9->super_VmValue).typeID != 2)) {
        pVVar9 = (VmInstruction *)0x0;
      }
      if ((((pVVar9 != (VmInstruction *)0x0) && (pVVar9->cmd == VM_INST_PHI)) &&
          (pVVar9 == pVVar16->prevSibling)) &&
         ((pVVar9 == pVVar15->firstInstruction && (uVar6 = (pVVar9->arguments).count, uVar6 != 0))))
      {
        uVar8 = 0;
        do {
          ppVVar3 = (pVVar9->arguments).data;
          pVVar10 = ppVVar3[uVar8];
          if ((pVVar10 == (VmValue *)0x0) || (pVVar10->typeID != 2)) {
            pVVar10 = (VmValue *)0x0;
          }
          uVar12 = (int)uVar8 + 1;
          if (uVar6 <= uVar12) goto LAB_0028a467;
          pVVar4 = *(VmInstruction **)&ppVVar3[uVar12][1].hasSideEffects;
          if (pVVar4->cmd == VM_INST_JUMP) {
            if ((pVVar4->arguments).count == 0) goto LAB_0028a467;
            if ((VmBlock *)*(pVVar4->arguments).data != pVVar15) {
              __assert_fail("terminator->arguments[0] == curr",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                            ,0x142c,
                            "void RunControlFlowOptimization(ExpressionContext &, VmModule *, VmValue *)"
                           );
            }
            anon_unknown.dwarf_233176::ChangeInstructionTo
                      (module,pVVar4,VM_INST_RETURN,pVVar10,(VmValue *)0x0,(VmValue *)0x0,
                       (VmValue *)0x0,(VmValue *)0x0,optCount);
          }
          uVar12 = (int)uVar8 + 2;
          uVar8 = (ulong)uVar12;
          uVar6 = (pVVar9->arguments).count;
        } while (uVar12 < uVar6);
      }
    }
    if (pVVar16->cmd - VM_INST_JUMP_Z < 2) {
      uVar6 = (pVVar16->arguments).count;
      if ((uVar6 < 2) || (uVar6 == 2)) goto LAB_0028a467;
      ppVVar3 = (pVVar16->arguments).data;
      pVVar10 = ppVVar3[1];
      if (pVVar10 == ppVVar3[2]) {
        anon_unknown.dwarf_233176::ChangeInstructionTo
                  (module,pVVar16,VM_INST_JUMP,pVVar10,(VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,
                   (VmValue *)0x0,optCount);
      }
    }
    if ((pVVar16->cmd == VM_INST_UNYIELD) && ((pVVar16->arguments).count == 2)) {
      anon_unknown.dwarf_233176::ChangeInstructionTo
                (module,pVVar16,VM_INST_JUMP,(pVVar16->arguments).data[1],(VmValue *)0x0,
                 (VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,optCount);
    }
  }
  pVVar15 = pVVar15->nextSibling;
  if (pVVar15 == (VmBlock *)0x0) goto LAB_0028a335;
  goto LAB_00289e0b;
}

Assistant:

void RunControlFlowOptimization(ExpressionContext &ctx, VmModule *module, VmValue *value)
{
	(void)ctx;

	if(VmFunction *function = getType<VmFunction>(value))
	{
		for(VmBlock *curr = function->firstBlock; curr; curr = curr->nextSibling)
		{
			// Remove any instructions after a branch
			for(VmInstruction *inst = curr->firstInstruction; inst; inst = inst->nextSibling)
			{
				if(IsBlockTerminator(inst->cmd))
				{
					while(curr->lastInstruction && curr->lastInstruction != inst)
					{
						module->controlFlowSimplifications++;

						curr->RemoveInstruction(curr->lastInstruction);
					}
					break;
				}
			}

			// Merge together blocks if a block A ends with a branch to block B and block B only incoming blocks is block A
			VmInstruction *currLastInst = curr->lastInstruction;

			if(currLastInst && currLastInst->cmd == VM_INST_JUMP)
			{
				VmBlock *next = curr->nextSibling;

				if(next && currLastInst->arguments[0] == next && next->users.size() == 1 && next->users[0] == currLastInst)
				{
					// Fixup phi instructions
					for(VmInstruction *inst = next->firstInstruction; inst;)
					{
						VmInstruction *nextInst = inst->nextSibling;

						if(inst->cmd == VM_INST_PHI)
						{
							// Check that phi only expects us to come from the block we are merging with
							assert(inst->arguments.size() == 2 && inst->arguments[1] == curr);

							ReplaceValueUsersWith(module, inst, inst->arguments[0], &module->controlFlowSimplifications);
						}

						inst = nextInst;
					}

					// Steal target block instructions
					for(VmInstruction *inst = next->firstInstruction; inst; inst = inst->nextSibling)
						inst->parent = curr;

					if(curr->lastInstruction)
						curr->lastInstruction->nextSibling = next->firstInstruction;

					if(next->firstInstruction)
					{
						next->firstInstruction->prevSibling = curr->lastInstruction;

						curr->lastInstruction = next->lastInstruction;
					}

					next->firstInstruction = next->lastInstruction = NULL;

					// Remove branch
					if(currLastInst->parent)
						curr->RemoveInstruction(currLastInst);

					module->controlFlowSimplifications++;
				}
			}

			// Reverse conditional branch so that the false block jump will jump further than the true block jump
			if(currLastInst && (currLastInst->cmd == VM_INST_JUMP_Z || currLastInst->cmd == VM_INST_JUMP_NZ))
			{
				VmBlock *next = curr->nextSibling;

				if(currLastInst->arguments[2] == next)
				{
					VmValue *trueBlock = currLastInst->arguments[1];
					VmValue *falseBlock = currLastInst->arguments[2];

					currLastInst->cmd = currLastInst->cmd == VM_INST_JUMP_Z ? VM_INST_JUMP_NZ : VM_INST_JUMP_Z;

					currLastInst->arguments[1] = falseBlock;
					currLastInst->arguments[2] = trueBlock;

					module->controlFlowSimplifications++;
				}
			}

			// If block contains a single conditional jump, and the condition is a phi node with constant arguments, try to redirect predecessor to our target
			if(currLastInst && (currLastInst->cmd == VM_INST_JUMP_Z || currLastInst->cmd == VM_INST_JUMP_NZ))
			{
				VmInstruction *phi = getType<VmInstruction>(currLastInst->arguments[0]);
				VmValue *trueBlock = currLastInst->arguments[1];
				VmValue *falseBlock = currLastInst->arguments[2];

				if(phi && phi->cmd == VM_INST_PHI && phi == currLastInst->prevSibling && phi == curr->firstInstruction)
				{
					for(unsigned i = 0; i < phi->arguments.size(); i += 2)
					{
						VmInstruction *option = getType<VmInstruction>(phi->arguments[i]);
						VmBlock *edge = getType<VmBlock>(phi->arguments[i + 1]);

						if(option->cmd != VM_INST_LOAD_IMMEDIATE)
							continue;

						VmConstant *condition = getType<VmConstant>(option->arguments[0]);

						VmValue *target = condition->iValue != 0 ? (currLastInst->cmd == VM_INST_JUMP_NZ ? trueBlock : falseBlock) : (currLastInst->cmd == VM_INST_JUMP_NZ ? falseBlock : trueBlock);

						VmInstruction *terminator = edge->lastInstruction;

						if(terminator->cmd == VM_INST_JUMP)
						{
							assert(terminator->arguments[0] == curr);

							ReplaceValue(module, terminator, terminator->arguments[0], target);

							module->controlFlowSimplifications++;
						}
					}
				}
			}

			// If block contains a return, and the return value is a phi node with constant arguments, try to return directly from predecessors
			if(currLastInst && currLastInst->cmd == VM_INST_RETURN && !currLastInst->arguments.empty())
			{
				VmInstruction *phi = getType<VmInstruction>(currLastInst->arguments[0]);

				if(phi && phi->cmd == VM_INST_PHI && phi == currLastInst->prevSibling && phi == curr->firstInstruction)
				{
					for(unsigned i = 0; i < phi->arguments.size(); i += 2)
					{
						VmInstruction *option = getType<VmInstruction>(phi->arguments[i]);
						VmBlock *edge = getType<VmBlock>(phi->arguments[i + 1]);

						VmInstruction *terminator = edge->lastInstruction;

						if(terminator->cmd == VM_INST_JUMP)
						{
							assert(terminator->arguments[0] == curr);

							ChangeInstructionTo(module, terminator, VM_INST_RETURN, option, NULL, NULL, NULL, NULL, &module->controlFlowSimplifications);
						}
					}
				}
			}

			// Reverse conditional jump with unconditional if both targets are the same
			if(currLastInst && (currLastInst->cmd == VM_INST_JUMP_Z || currLastInst->cmd == VM_INST_JUMP_NZ))
			{
				VmValue *trueBlock = currLastInst->arguments[1];
				VmValue *falseBlock = currLastInst->arguments[2];

				if(trueBlock == falseBlock)
					ChangeInstructionTo(module, currLastInst, VM_INST_JUMP, trueBlock, NULL, NULL, NULL, NULL, &module->controlFlowSimplifications);
			}

			// Remove coroutine unyield that only contains a single target
			if(currLastInst && currLastInst->cmd == VM_INST_UNYIELD && currLastInst->arguments.size() == 2)
			{
				VmValue *targetBlock = currLastInst->arguments[1];

				ChangeInstructionTo(module, currLastInst, VM_INST_JUMP, targetBlock, NULL, NULL, NULL, NULL, &module->controlFlowSimplifications);
			}
		}

		for(VmBlock *curr = function->firstBlock; curr;)
		{
			VmBlock *next = curr->nextSibling;

			if(curr->firstInstruction && curr->firstInstruction == curr->lastInstruction && curr->firstInstruction->cmd == VM_INST_JUMP && curr != function->firstBlock)
			{
				// Remove blocks that only contain an unconditional branch to some other block
				VmBlock *target = getType<VmBlock>(curr->firstInstruction->arguments[0]);

				assert(target);

				// Do not replace block if it is an incoming phi instruction argument
				bool hasPhiUser = false;

				for(unsigned i = 0; i < curr->users.size(); i++)
				{
					if(VmInstruction *inst = getType<VmInstruction>(curr->users[i]))
					{
						if(inst->cmd == VM_INST_PHI)
						{
							hasPhiUser = true;
							break;
						}
					}
				}

				if(!hasPhiUser)
					ReplaceValueUsersWith(module, curr, target, &module->controlFlowSimplifications);
			}

			if(curr->users.empty() && !curr->HasExternalInstructionUsers())
			{
				// Remove unused blocks
				function->RemoveBlock(curr);

				module->controlFlowSimplifications++;
			}

			curr = next;
		}
	}
}